

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_status_enum.c
# Opt level: O2

void check_errorstrings(amqp_status_enum start,amqp_status_enum end)

{
  int iVar1;
  char *pcVar2;
  amqp_status_enum code;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)start;
  while( true ) {
    code = (amqp_status_enum)uVar3;
    if (code <= end) {
      return;
    }
    pcVar2 = amqp_error_string2(code);
    iVar1 = strcmp(pcVar2,"(unknown error)");
    if (iVar1 == 0) break;
    uVar3 = (ulong)(uint)(code + AMQP_STATUS_NO_MEMORY);
  }
  pcVar2 = "";
  if (code < AMQP_STATUS_OK) {
    pcVar2 = "-";
  }
  printf("amqp_status_enum value %s%X",pcVar2,uVar3);
  abort();
}

Assistant:

static void check_errorstrings(amqp_status_enum start, amqp_status_enum end) {
  int i;
  for (i = start; i > end; --i) {
    const char* err = amqp_error_string2(i);
    if (0 == strcmp(err, "(unknown error)")) {
      printf("amqp_status_enum value %s%X", i < 0 ? "-" : "", (unsigned)i);
      abort();
    }
  }
}